

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void __thiscall despot::Logger::~Logger(Logger *this)

{
  Logger *this_local;
  
  this->_vptr_Logger = (_func_int **)&PTR__Logger_0026e658;
  std::vector<double,_std::allocator<double>_>::~vector(&this->undiscounted_round_rewards_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->discounted_round_rewards_);
  std::__cxx11::string::~string((string *)&this->world_type_);
  return;
}

Assistant:

Logger::~Logger() {
}